

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedFallback(SerialArena *this,size_t n)

{
  ArenaBlock *this_00;
  __pointer_type pcVar1;
  bool bVar2;
  char *pcVar3;
  ArenaBlock *this_01;
  char *pcVar4;
  SizedPtr SVar5;
  void *ret;
  void *local_38;
  LogMessageFatal local_30 [16];
  
  this_00 = (this->head_)._M_b._M_p;
  if (this_00->size != 0) {
    pcVar1 = (this->ptr_)._M_b._M_p;
    pcVar3 = ArenaBlock::Pointer(this_00,0x10);
    (this->space_used_).super___atomic_base<unsigned_long>._M_i =
         (__int_type_conflict)
         (pcVar1 + ((this->space_used_).super___atomic_base<unsigned_long>._M_i - (long)pcVar3));
  }
  SVar5 = anon_unknown_12::AllocateBlock
                    ((AllocationPolicy *)
                     ((this->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8),this_00->size,n);
  this_01 = (ArenaBlock *)SVar5.p;
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (this->space_allocated_).super___atomic_base<unsigned_long>._M_i + SVar5.n;
  ArenaBlock::ArenaBlock(this_01,this_00,SVar5.n);
  pcVar3 = ArenaBlock::Pointer(this_01,0x10);
  pcVar4 = ArenaBlock::Pointer(this_01,this_01->size & 0xfffffffffffffff8);
  (this->ptr_)._M_b._M_p = pcVar3;
  this->prefetch_ptr_ = pcVar3;
  this->limit_ = pcVar4;
  (this->head_)._M_b._M_p = this_01;
  local_38 = (void *)0x0;
  bVar2 = MaybeAllocateAligned(this,n,&local_38);
  if (bVar2) {
    return local_38;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/arena.cc"
             ,0x114,3,"res");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

PROTOBUF_NOINLINE
void* SerialArena::AllocateAlignedFallback(size_t n) {
  AllocateNewBlock(n);
  void* ret = nullptr;
  bool res = MaybeAllocateAligned(n, &ret);
  ABSL_DCHECK(res);
  return ret;
}